

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O1

void Cnf_ManFreeCuts(Cnf_Man_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pVVar2 = p->pManAig->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = pVVar2->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && (*(Cnf_Cut_t **)((long)pvVar1 + 0x28) != (Cnf_Cut_t *)0x0)) {
        Cnf_CutFree(*(Cnf_Cut_t **)((long)pvVar1 + 0x28));
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
      }
      lVar3 = lVar3 + 1;
      pVVar2 = p->pManAig->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Cnf_ManFreeCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pManAig, pObj, i )
        if ( pObj->pData )
        {
            Cnf_CutFree( (Cnf_Cut_t *)pObj->pData );
            pObj->pData = NULL;
        }
}